

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack8to4_int8.h
# Opt level: O2

void ncnn::im2col_sgemm_pack8to4_int8_sse(Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  undefined1 auVar1 [16];
  uint uVar2;
  void *pvVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint _c;
  undefined8 uVar11;
  int *piVar12;
  int iVar13;
  ulong uVar14;
  undefined1 (*pauVar15) [16];
  uint uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  undefined1 (*pauVar21) [16];
  undefined8 *puVar22;
  long lVar23;
  int q;
  ulong uVar24;
  long lVar25;
  undefined8 *puVar26;
  int iVar27;
  ulong uVar28;
  int iVar29;
  bool bVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [64];
  undefined1 auVar33 [16];
  undefined1 auVar34 [64];
  undefined1 auVar35 [16];
  undefined1 auVar36 [64];
  undefined1 auVar37 [16];
  undefined1 auVar38 [64];
  undefined1 auVar39 [16];
  undefined1 auVar40 [64];
  undefined1 auVar41 [16];
  undefined1 auVar42 [64];
  undefined1 auVar43 [16];
  undefined1 auVar44 [64];
  undefined1 auVar45 [16];
  undefined1 auVar46 [64];
  undefined1 local_98 [64];
  size_t local_58;
  ulong local_48;
  Mat *local_40;
  void *local_38;
  
  iVar13 = cpu_support_x86_avx2();
  if (iVar13 != 0) {
    im2col_sgemm_pack8to4_int8_sse_avx2(bottom_im2col,top_blob,kernel,opt);
    return;
  }
  iVar13 = cpu_support_x86_xop();
  if (iVar13 == 0) {
    uVar2 = bottom_im2col->w;
    lVar18 = (long)(int)uVar2;
    iVar13 = bottom_im2col->h;
    uVar16 = bottom_im2col->c;
    local_48 = (ulong)(uint)top_blob->c;
    local_58 = 0;
    local_98._16_8_ = 0;
    local_98._24_4_ = 0;
    local_98._0_8_ = (void *)0x0;
    local_98._8_4_ = 0;
    local_98._12_4_ = 0;
    local_98._48_12_ = SUB1612((undefined1  [16])0x0,4);
    local_98._32_8_ = (Allocator *)0x0;
    local_98._40_4_ = 0;
    local_98._44_4_ = 0;
    _c = (uVar2 & 1) + (uVar2 >> 1);
    if (lVar18 < 2) {
      _c = uVar2;
    }
    local_40 = top_blob;
    Mat::create((Mat *)local_98,iVar13 << (1 < lVar18),uVar16,_c,8,8,opt->workspace_allocator);
    uVar14 = 0;
    iVar29 = 0;
    if (0 < iVar13) {
      iVar29 = iVar13;
    }
    uVar19 = 0;
    if (0 < (int)uVar16) {
      uVar19 = (ulong)uVar16;
    }
    uVar28 = (ulong)(uint)((int)uVar2 >> 1);
    if ((int)uVar2 >> 1 < 1) {
      uVar28 = uVar14;
    }
    for (uVar17 = 0; uVar17 != uVar28; uVar17 = uVar17 + 1) {
      puVar22 = (undefined8 *)(local_58 * uVar17 * local_98._16_8_ + local_98._0_8_);
      for (uVar24 = 0; uVar24 != uVar19; uVar24 = uVar24 + 1) {
        puVar26 = (undefined8 *)
                  ((long)bottom_im2col->data +
                  bottom_im2col->cstep * bottom_im2col->elemsize * uVar24 + uVar14);
        iVar27 = iVar29;
        while (bVar30 = iVar27 != 0, iVar27 = iVar27 + -1, bVar30) {
          uVar11 = puVar26[1];
          *puVar22 = *puVar26;
          puVar22[1] = uVar11;
          puVar22 = puVar22 + 2;
          puVar26 = puVar26 + lVar18;
        }
      }
      uVar14 = uVar14 + 0x10;
    }
    local_38 = (void *)local_98._0_8_;
    uVar14 = (ulong)(int)(uVar2 & 0xfffffffe);
    lVar25 = uVar14 * 8;
    for (; (long)uVar14 < lVar18; uVar14 = uVar14 + 1) {
      uVar28 = (ulong)(uint)((int)uVar14 >> 0x1f) << 0x20 | uVar14 & 0xffffffff;
      puVar22 = (undefined8 *)
                ((long)((int)((long)uVar28 % 2) + (int)((long)uVar28 / 2)) * local_58 *
                 local_98._16_8_ + local_98._0_8_);
      pvVar3 = bottom_im2col->data;
      for (uVar28 = 0; uVar28 != uVar19; uVar28 = uVar28 + 1) {
        puVar26 = (undefined8 *)
                  ((long)pvVar3 + bottom_im2col->cstep * bottom_im2col->elemsize * uVar28 + lVar25);
        iVar27 = iVar29;
        while (bVar30 = iVar27 != 0, iVar27 = iVar27 + -1, bVar30) {
          *puVar22 = *puVar26;
          puVar22 = puVar22 + 1;
          puVar26 = puVar26 + lVar18;
        }
      }
      lVar25 = lVar25 + 8;
    }
    uVar19 = 0;
    uVar14 = (ulong)(uVar16 * iVar13);
    if ((int)(uVar16 * iVar13) < 1) {
      uVar14 = uVar19;
    }
    uVar28 = local_48 & 0xffffffff;
    if ((int)local_48 < 1) {
      uVar28 = uVar19;
    }
    for (; uVar19 != uVar28; uVar19 = uVar19 + 1) {
      pauVar15 = (undefined1 (*) [16])
                 (local_40->cstep * uVar19 * local_40->elemsize + (long)local_40->data);
      lVar25 = 0;
      for (uVar17 = 0; (long)(uVar17 | 1) < lVar18; uVar17 = uVar17 + 2) {
        lVar20 = kernel->cstep * uVar19 * kernel->elemsize;
        auVar32 = ZEXT1664((undefined1  [16])0x0);
        lVar23 = 0;
        auVar34 = ZEXT1664((undefined1  [16])0x0);
        auVar36 = ZEXT1664((undefined1  [16])0x0);
        auVar38 = ZEXT1664((undefined1  [16])0x0);
        auVar40 = ZEXT1664((undefined1  [16])0x0);
        auVar42 = ZEXT1664((undefined1  [16])0x0);
        auVar44 = ZEXT1664((undefined1  [16])0x0);
        auVar46 = ZEXT1664((undefined1  [16])0x0);
        uVar24 = uVar14;
        while( true ) {
          iVar13 = (int)uVar24;
          uVar24 = (ulong)(iVar13 - 1);
          auVar43 = auVar44._0_16_;
          auVar45 = auVar46._0_16_;
          auVar39 = auVar40._0_16_;
          auVar41 = auVar42._0_16_;
          auVar35 = auVar36._0_16_;
          auVar37 = auVar38._0_16_;
          auVar31 = auVar32._0_16_;
          auVar33 = auVar34._0_16_;
          if (iVar13 == 0) break;
          auVar1 = *(undefined1 (*) [16])
                    (local_98._0_8_ + lVar23 + local_58 * local_98._16_8_ * lVar25);
          auVar4 = vpcmpgtb_avx((undefined1  [16])0x0,auVar1);
          auVar8 = vpunpcklbw_avx(auVar1,auVar4);
          auVar7 = vpunpckhbw_avx(auVar1,auVar4);
          auVar1 = *(undefined1 (*) [16])((long)kernel->data + lVar23 * 2 + lVar20);
          auVar4 = *(undefined1 (*) [16])((long)kernel->data + lVar23 * 2 + lVar20 + 0x10);
          auVar5 = vpcmpgtb_avx((undefined1  [16])0x0,auVar1);
          auVar6 = vpcmpgtb_avx((undefined1  [16])0x0,auVar4);
          auVar9 = vpunpcklbw_avx(auVar1,auVar5);
          auVar5 = vpunpckhbw_avx(auVar1,auVar5);
          auVar10 = vpunpcklbw_avx(auVar4,auVar6);
          auVar4 = vpunpckhbw_avx(auVar4,auVar6);
          auVar1 = vpmaddwd_avx(auVar8,auVar9);
          auVar45 = vpaddd_avx(auVar1,auVar45);
          auVar46 = ZEXT1664(auVar45);
          auVar45 = vpmaddwd_avx(auVar8,auVar5);
          auVar43 = vpaddd_avx(auVar45,auVar43);
          auVar44 = ZEXT1664(auVar43);
          auVar43 = vpmaddwd_avx(auVar8,auVar10);
          auVar41 = vpaddd_avx(auVar43,auVar41);
          auVar42 = ZEXT1664(auVar41);
          auVar41 = vpmaddwd_avx(auVar8,auVar4);
          auVar39 = vpaddd_avx(auVar41,auVar39);
          auVar40 = ZEXT1664(auVar39);
          auVar39 = vpmaddwd_avx(auVar7,auVar9);
          auVar37 = vpaddd_avx(auVar39,auVar37);
          auVar38 = ZEXT1664(auVar37);
          auVar37 = vpmaddwd_avx(auVar7,auVar5);
          auVar35 = vpaddd_avx(auVar37,auVar35);
          auVar36 = ZEXT1664(auVar35);
          auVar35 = vpmaddwd_avx(auVar7,auVar10);
          auVar33 = vpaddd_avx(auVar35,auVar33);
          auVar34 = ZEXT1664(auVar33);
          auVar33 = vpmaddwd_avx(auVar7,auVar4);
          auVar31 = vpaddd_avx(auVar33,auVar31);
          auVar32 = ZEXT1664(auVar31);
          lVar23 = lVar23 + 0x10;
        }
        auVar1 = vpunpckldq_avx(auVar45,auVar43);
        auVar4 = vpunpckldq_avx(auVar41,auVar39);
        auVar43 = vpunpckhdq_avx(auVar45,auVar43);
        auVar39 = vpunpckhdq_avx(auVar41,auVar39);
        auVar41 = vpunpckldq_avx(auVar37,auVar35);
        auVar45 = vpunpckldq_avx(auVar33,auVar31);
        auVar35 = vpunpckhdq_avx(auVar37,auVar35);
        auVar37 = vpunpckhdq_avx(auVar33,auVar31);
        auVar33 = vpunpcklqdq_avx(auVar1,auVar4);
        auVar31 = vpunpckhqdq_avx(auVar1,auVar4);
        auVar31 = vpaddd_avx(auVar33,auVar31);
        auVar1 = vpunpcklqdq_avx(auVar43,auVar39);
        auVar33 = vpunpckhqdq_avx(auVar43,auVar39);
        auVar33 = vpaddd_avx(auVar33,auVar1);
        auVar31 = vpaddd_avx(auVar31,auVar33);
        auVar39 = vpunpcklqdq_avx(auVar41,auVar45);
        auVar33 = vpunpckhqdq_avx(auVar41,auVar45);
        auVar33 = vpaddd_avx(auVar39,auVar33);
        auVar39 = vpunpcklqdq_avx(auVar35,auVar37);
        auVar35 = vpunpckhqdq_avx(auVar35,auVar37);
        auVar35 = vpaddd_avx(auVar35,auVar39);
        auVar33 = vpaddd_avx(auVar33,auVar35);
        *pauVar15 = auVar31;
        pauVar15[1] = auVar33;
        pauVar15 = pauVar15 + 2;
        lVar25 = lVar25 + 1;
      }
      while (uVar16 = (uint)uVar17, (int)uVar16 < (int)uVar2) {
        pauVar21 = (undefined1 (*) [16])
                   (kernel->cstep * uVar19 * kernel->elemsize + (long)kernel->data);
        auVar32 = ZEXT1664((undefined1  [16])0x0);
        lVar25 = 0;
        auVar34 = ZEXT1664((undefined1  [16])0x0);
        auVar36 = ZEXT1664((undefined1  [16])0x0);
        auVar38 = ZEXT1664((undefined1  [16])0x0);
        while( true ) {
          auVar31 = auVar32._0_16_;
          auVar33 = auVar34._0_16_;
          auVar35 = auVar36._0_16_;
          auVar37 = auVar38._0_16_;
          if ((int)uVar14 == (int)lVar25) break;
          auVar39._8_8_ = 0;
          auVar39._0_8_ =
               *(ulong *)(local_98._0_8_ +
                         lVar25 * 8 +
                         local_58 * local_98._16_8_ *
                         (ulong)((uVar16 & 1) + ((uint)(uVar17 >> 1) & 0x7fffffff)));
          auVar1 = vpmovsxbw_avx(auVar39);
          auVar39 = *pauVar21;
          auVar41 = pauVar21[1];
          auVar43 = vpcmpgtb_avx((undefined1  [16])0x0,auVar39);
          auVar45 = vpcmpgtb_avx((undefined1  [16])0x0,auVar41);
          auVar4 = vpunpcklbw_avx(auVar39,auVar43);
          auVar43 = vpunpckhbw_avx(auVar39,auVar43);
          auVar5 = vpunpcklbw_avx(auVar41,auVar45);
          auVar41 = vpunpckhbw_avx(auVar41,auVar45);
          auVar39 = vpmaddwd_avx(auVar4,auVar1);
          auVar31 = vpaddd_avx(auVar39,auVar31);
          auVar32 = ZEXT1664(auVar31);
          auVar31 = vpmaddwd_avx(auVar1,auVar43);
          auVar31 = vpaddd_avx(auVar31,auVar33);
          auVar34 = ZEXT1664(auVar31);
          auVar31 = vpmaddwd_avx(auVar5,auVar1);
          auVar31 = vpaddd_avx(auVar31,auVar35);
          auVar36 = ZEXT1664(auVar31);
          auVar31 = vpmaddwd_avx(auVar1,auVar41);
          auVar31 = vpaddd_avx(auVar31,auVar37);
          auVar38 = ZEXT1664(auVar31);
          pauVar21 = pauVar21 + 2;
          lVar25 = lVar25 + 1;
        }
        auVar39 = vpunpckldq_avx(auVar31,auVar33);
        auVar41 = vpunpckldq_avx(auVar35,auVar37);
        auVar33 = vpunpckhdq_avx(auVar31,auVar33);
        auVar35 = vpunpckhdq_avx(auVar35,auVar37);
        auVar37 = vpunpcklqdq_avx(auVar39,auVar41);
        auVar31 = vpunpckhqdq_avx(auVar39,auVar41);
        auVar31 = vpaddd_avx(auVar37,auVar31);
        auVar37 = vpunpcklqdq_avx(auVar33,auVar35);
        auVar33 = vpunpckhqdq_avx(auVar33,auVar35);
        auVar33 = vpaddd_avx(auVar33,auVar37);
        auVar31 = vpaddd_avx(auVar31,auVar33);
        *pauVar15 = auVar31;
        pauVar15 = pauVar15 + 1;
        uVar17 = (ulong)(uVar16 + 1);
      }
    }
    piVar12 = (int *)CONCAT44(local_98._12_4_,local_98._8_4_);
    if (piVar12 != (int *)0x0) {
      LOCK();
      *piVar12 = *piVar12 + -1;
      UNLOCK();
      if (*piVar12 == 0) {
        if ((Allocator *)local_98._32_8_ == (Allocator *)0x0) {
          free((void *)local_98._0_8_);
        }
        else {
          (*(*(_func_int ***)local_98._32_8_)[3])();
        }
      }
    }
    return;
  }
  im2col_sgemm_pack8to4_int8_sse_xop(bottom_im2col,top_blob,kernel,opt);
  return;
}

Assistant:

static void im2col_sgemm_pack8to4_int8_sse(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
#if !(__AVX512VNNI__ || __AVXVNNI__ || __AVX2__ || __XOP__)
#if NCNN_RUNTIME_CPU && NCNN_AVX512VNNI && __AVX512F__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx512_vnni())
    {
        im2col_sgemm_pack8to4_int8_sse_avx512vnni(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVXVNNI && __AVX2__ && !__AVXVNNI__
    if (ncnn::cpu_support_x86_avx_vnni())
    {
        im2col_sgemm_pack8to4_int8_sse_avxvnni(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVX2 && __AVX__ && !__AVX2__
    if (ncnn::cpu_support_x86_avx2())
    {
        im2col_sgemm_pack8to4_int8_sse_avx2(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_XOP && __SSE2__ && !__XOP__
    if (ncnn::cpu_support_x86_xop())
    {
        im2col_sgemm_pack8to4_int8_sse_xop(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif
#endif

    // Mat bottom_im2col(size, maxk, inch, 8u, 8, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    // permute
    Mat tmp;
#if __AVX2__
    if (size >= 4)
        tmp.create(4 * maxk, inch, size / 4 + (size % 4) / 2 + size % 2, 8u, 8, opt.workspace_allocator);
    else if (size >= 2)
        tmp.create(2 * maxk, inch, size / 2 + size % 2, 8u, 8, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 8u, 8, opt.workspace_allocator);
#else
    if (size >= 2)
        tmp.create(2 * maxk, inch, size / 2 + size % 2, 8u, 8, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 8u, 8, opt.workspace_allocator);
#endif
    {
#if __AVX2__
        int remain_size_start = 0;
        int nn_size = size >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 4;

            int64_t* tmpptr = tmp.channel(i / 4);

            for (int q = 0; q < inch; q++)
            {
                const int64_t* img0 = (const int64_t*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m256i _v = _mm256_loadu_si256((const __m256i*)img0);
                    _mm256_storeu_si256((__m256i*)tmpptr, _v);
                    tmpptr += 4;
                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 2;
        nn_size = (size - remain_size_start) >> 1;
#else
        int remain_size_start = 0;
        int nn_size = size >> 1;
#endif

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 2;

#if __AVX2__
            int64_t* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            int64_t* tmpptr = tmp.channel(i / 2);
#endif

            for (int q = 0; q < inch; q++)
            {
                const int64_t* img0 = (const int64_t*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m128i _v = _mm_loadu_si128((const __m128i*)img0);
                    _mm_storeu_si128((__m128i*)tmpptr, _v);
                    tmpptr += 2;
                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 1;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
#if __AVX2__
            int64_t* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            int64_t* tmpptr = tmp.channel(i / 2 + i % 2);
#endif

            for (int q = 0; q < inch; q++)
            {
                const int64_t* img0 = (const int64_t*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr += 1;
                    img0 += size;
                }
            }
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        int* outptr0 = top_blob.channel(p);

        int i = 0;
#if __AVX2__
        for (; i + 3 < size; i += 4)
        {
            const signed char* tmpptr = tmp.channel(i / 4);
            const signed char* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

            __m256i _sum00_11 = _mm256_setzero_si256();
            __m256i _sum10_01 = _mm256_setzero_si256();
            __m256i _sum02_13 = _mm256_setzero_si256();
            __m256i _sum12_03 = _mm256_setzero_si256();

            __m256i _sum04_15 = _mm256_setzero_si256();
            __m256i _sum14_05 = _mm256_setzero_si256();
            __m256i _sum06_17 = _mm256_setzero_si256();
            __m256i _sum16_07 = _mm256_setzero_si256();

            int j = 0;
            for (; j < nn; j++)
            {
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                __m256i _w23_16 = _mm256_cvtepi8_epi16(_w23);

                __m256i _val10_16 = _mm256_permute4x64_epi64(_val01_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum00_11 = _mm256_dpwssd_epi32(_sum00_11, _val01_16, _w01_16);
                _sum10_01 = _mm256_dpwssd_epi32(_sum10_01, _val10_16, _w01_16);
                _sum02_13 = _mm256_dpwssd_epi32(_sum02_13, _val01_16, _w23_16);
                _sum12_03 = _mm256_dpwssd_epi32(_sum12_03, _val10_16, _w23_16);
#else
                _sum00_11 = _mm256_add_epi32(_sum00_11, _mm256_madd_epi16(_val01_16, _w01_16));
                _sum10_01 = _mm256_add_epi32(_sum10_01, _mm256_madd_epi16(_val10_16, _w01_16));
                _sum02_13 = _mm256_add_epi32(_sum02_13, _mm256_madd_epi16(_val01_16, _w23_16));
                _sum12_03 = _mm256_add_epi32(_sum12_03, _mm256_madd_epi16(_val10_16, _w23_16));
#endif

                __m128i _val23 = _mm_loadu_si128((const __m128i*)(tmpptr + 16));
                __m256i _val23_16 = _mm256_cvtepi8_epi16(_val23);
                __m256i _val32_16 = _mm256_permute4x64_epi64(_val23_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum04_15 = _mm256_dpwssd_epi32(_sum04_15, _val23_16, _w01_16);
                _sum14_05 = _mm256_dpwssd_epi32(_sum14_05, _val32_16, _w01_16);
                _sum06_17 = _mm256_dpwssd_epi32(_sum06_17, _val23_16, _w23_16);
                _sum16_07 = _mm256_dpwssd_epi32(_sum16_07, _val32_16, _w23_16);
#else
                _sum04_15 = _mm256_add_epi32(_sum04_15, _mm256_madd_epi16(_val23_16, _w01_16));
                _sum14_05 = _mm256_add_epi32(_sum14_05, _mm256_madd_epi16(_val32_16, _w01_16));
                _sum06_17 = _mm256_add_epi32(_sum06_17, _mm256_madd_epi16(_val23_16, _w23_16));
                _sum16_07 = _mm256_add_epi32(_sum16_07, _mm256_madd_epi16(_val32_16, _w23_16));
#endif

                tmpptr += 32;
                kptr0 += 32;
            }

            // transpose 4x8
            {
                __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm256_unpacklo_epi32(_sum00_11, _sum10_01);
                _tmp1 = _mm256_unpacklo_epi32(_sum02_13, _sum12_03);
                _tmp2 = _mm256_unpackhi_epi32(_sum00_11, _sum10_01);
                _tmp3 = _mm256_unpackhi_epi32(_sum02_13, _sum12_03);
                _sum00_11 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                _sum10_01 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                _sum02_13 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                _sum12_03 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
            }
            {
                __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm256_unpacklo_epi32(_sum04_15, _sum14_05);
                _tmp1 = _mm256_unpacklo_epi32(_sum06_17, _sum16_07);
                _tmp2 = _mm256_unpackhi_epi32(_sum04_15, _sum14_05);
                _tmp3 = _mm256_unpackhi_epi32(_sum06_17, _sum16_07);
                _sum04_15 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                _sum14_05 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                _sum06_17 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                _sum16_07 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum10_01);
            _sum02_13 = _mm256_add_epi32(_sum02_13, _sum12_03);
            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum02_13);

            _sum04_15 = _mm256_add_epi32(_sum04_15, _sum14_05);
            _sum06_17 = _mm256_add_epi32(_sum06_17, _sum16_07);
            _sum04_15 = _mm256_add_epi32(_sum04_15, _sum06_17);

            __m256i _perm_mask = _mm256_set_epi32(6, 3, 4, 1, 7, 2, 5, 0);
            _sum00_11 = _mm256_permutevar8x32_epi32(_sum00_11, _perm_mask);
            _sum04_15 = _mm256_permutevar8x32_epi32(_sum04_15, _perm_mask);

            _mm256_storeu_si256((__m256i*)outptr0, _sum00_11);
            _mm256_storeu_si256((__m256i*)(outptr0 + 8), _sum04_15);
            outptr0 += 16;
        }
#endif
        for (; i + 1 < size; i += 2)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2);
#endif
            const signed char* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

#if __AVX2__
            __m256i _sum00_11 = _mm256_setzero_si256();
            __m256i _sum10_01 = _mm256_setzero_si256();
            __m256i _sum02_13 = _mm256_setzero_si256();
            __m256i _sum12_03 = _mm256_setzero_si256();
#else
            __m128i _sum00 = _mm_setzero_si128();
            __m128i _sum01 = _mm_setzero_si128();
            __m128i _sum02 = _mm_setzero_si128();
            __m128i _sum03 = _mm_setzero_si128();
            __m128i _sum10 = _mm_setzero_si128();
            __m128i _sum11 = _mm_setzero_si128();
            __m128i _sum12 = _mm_setzero_si128();
            __m128i _sum13 = _mm_setzero_si128();
#endif

            int j = 0;
            for (; j < nn; j++)
            {
#if __AVX2__
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                __m256i _w23_16 = _mm256_cvtepi8_epi16(_w23);

                __m256i _val10_16 = _mm256_permute4x64_epi64(_val01_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum00_11 = _mm256_dpwssd_epi32(_sum00_11, _val01_16, _w01_16);
                _sum10_01 = _mm256_dpwssd_epi32(_sum10_01, _val10_16, _w01_16);
                _sum02_13 = _mm256_dpwssd_epi32(_sum02_13, _val01_16, _w23_16);
                _sum12_03 = _mm256_dpwssd_epi32(_sum12_03, _val10_16, _w23_16);
#else
                _sum00_11 = _mm256_add_epi32(_sum00_11, _mm256_madd_epi16(_val01_16, _w01_16));
                _sum10_01 = _mm256_add_epi32(_sum10_01, _mm256_madd_epi16(_val10_16, _w01_16));
                _sum02_13 = _mm256_add_epi32(_sum02_13, _mm256_madd_epi16(_val01_16, _w23_16));
                _sum12_03 = _mm256_add_epi32(_sum12_03, _mm256_madd_epi16(_val10_16, _w23_16));
#endif
#else
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                __m128i _val0 = _mm_unpacklo_epi8(_val01, _extval01);
                __m128i _val1 = _mm_unpackhi_epi8(_val01, _extval01);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                __m128i _extw23 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w23);
                __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);
                __m128i _w2 = _mm_unpacklo_epi8(_w23, _extw23);
                __m128i _w3 = _mm_unpackhi_epi8(_w23, _extw23);

#if __XOP__
                _sum00 = _mm_maddd_epi16(_val0, _w0, _sum00);
                _sum01 = _mm_maddd_epi16(_val0, _w1, _sum01);
                _sum02 = _mm_maddd_epi16(_val0, _w2, _sum02);
                _sum03 = _mm_maddd_epi16(_val0, _w3, _sum03);
                _sum10 = _mm_maddd_epi16(_val1, _w0, _sum10);
                _sum11 = _mm_maddd_epi16(_val1, _w1, _sum11);
                _sum12 = _mm_maddd_epi16(_val1, _w2, _sum12);
                _sum13 = _mm_maddd_epi16(_val1, _w3, _sum13);
#else
                _sum00 = _mm_add_epi32(_mm_madd_epi16(_val0, _w0), _sum00);
                _sum01 = _mm_add_epi32(_mm_madd_epi16(_val0, _w1), _sum01);
                _sum02 = _mm_add_epi32(_mm_madd_epi16(_val0, _w2), _sum02);
                _sum03 = _mm_add_epi32(_mm_madd_epi16(_val0, _w3), _sum03);
                _sum10 = _mm_add_epi32(_mm_madd_epi16(_val1, _w0), _sum10);
                _sum11 = _mm_add_epi32(_mm_madd_epi16(_val1, _w1), _sum11);
                _sum12 = _mm_add_epi32(_mm_madd_epi16(_val1, _w2), _sum12);
                _sum13 = _mm_add_epi32(_mm_madd_epi16(_val1, _w3), _sum13);
#endif
#endif

                tmpptr += 16;
                kptr0 += 32;
            }

#if __AVX2__
            // transpose 4x8
            {
                __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm256_unpacklo_epi32(_sum00_11, _sum10_01);
                _tmp1 = _mm256_unpacklo_epi32(_sum02_13, _sum12_03);
                _tmp2 = _mm256_unpackhi_epi32(_sum00_11, _sum10_01);
                _tmp3 = _mm256_unpackhi_epi32(_sum02_13, _sum12_03);
                _sum00_11 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                _sum10_01 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                _sum02_13 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                _sum12_03 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum10_01);
            _sum02_13 = _mm256_add_epi32(_sum02_13, _sum12_03);
            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum02_13);

            __m256i _perm_mask = _mm256_set_epi32(6, 3, 4, 1, 7, 2, 5, 0);
            _sum00_11 = _mm256_permutevar8x32_epi32(_sum00_11, _perm_mask);

            _mm256_storeu_si256((__m256i*)outptr0, _sum00_11);
#else
            // transpose 4x4
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum00, _sum01);
                _tmp1 = _mm_unpacklo_epi32(_sum02, _sum03);
                _tmp2 = _mm_unpackhi_epi32(_sum00, _sum01);
                _tmp3 = _mm_unpackhi_epi32(_sum02, _sum03);
                _sum00 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum01 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum02 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum03 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum10, _sum11);
                _tmp1 = _mm_unpacklo_epi32(_sum12, _sum13);
                _tmp2 = _mm_unpackhi_epi32(_sum10, _sum11);
                _tmp3 = _mm_unpackhi_epi32(_sum12, _sum13);
                _sum10 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum11 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum12 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum13 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum00 = _mm_add_epi32(_sum00, _sum01);
            _sum02 = _mm_add_epi32(_sum02, _sum03);
            _sum10 = _mm_add_epi32(_sum10, _sum11);
            _sum12 = _mm_add_epi32(_sum12, _sum13);

            _sum00 = _mm_add_epi32(_sum00, _sum02);
            _sum10 = _mm_add_epi32(_sum10, _sum12);

            _mm_storeu_si128((__m128i*)outptr0, _sum00);
            _mm_storeu_si128((__m128i*)(outptr0 + 4), _sum10);
#endif
            outptr0 += 8;
        }
        for (; i < size; i++)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2 + i % 2);
#endif
            const signed char* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

#if __AVX2__
            __m256i _sum0_1 = _mm256_setzero_si256();
            __m256i _sum2_3 = _mm256_setzero_si256();
#else
            __m128i _sum0 = _mm_setzero_si128();
            __m128i _sum1 = _mm_setzero_si128();
            __m128i _sum2 = _mm_setzero_si128();
            __m128i _sum3 = _mm_setzero_si128();
#endif

            int j = 0;
            for (; j < nn; j++)
            {
#if __AVX2__
                __m128i _val = _mm_loadl_epi64((const __m128i*)tmpptr);
                _val = _mm_cvtepi8_epi16(_val);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                __m256i _w23_16 = _mm256_cvtepi8_epi16(_w23);

                __m256i _valval = _mm256_inserti128_si256(_mm256_castsi128_si256(_val), _val, 1);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum0_1 = _mm256_dpwssd_epi32(_sum0_1, _valval, _w01_16);
                _sum2_3 = _mm256_dpwssd_epi32(_sum2_3, _valval, _w23_16);
#else
                _sum0_1 = _mm256_add_epi32(_sum0_1, _mm256_madd_epi16(_valval, _w01_16));
                _sum2_3 = _mm256_add_epi32(_sum2_3, _mm256_madd_epi16(_valval, _w23_16));
#endif
#else
                __m128i _val = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                _val = _mm_cvtepi8_epi16(_val);
#else
                _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));
#endif

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                __m128i _extw23 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w23);
                __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);
                __m128i _w2 = _mm_unpacklo_epi8(_w23, _extw23);
                __m128i _w3 = _mm_unpackhi_epi8(_w23, _extw23);

#if __XOP__
                _sum0 = _mm_maddd_epi16(_val, _w0, _sum0);
                _sum1 = _mm_maddd_epi16(_val, _w1, _sum1);
                _sum2 = _mm_maddd_epi16(_val, _w2, _sum2);
                _sum3 = _mm_maddd_epi16(_val, _w3, _sum3);
#else
                _sum0 = _mm_add_epi32(_mm_madd_epi16(_val, _w0), _sum0);
                _sum1 = _mm_add_epi32(_mm_madd_epi16(_val, _w1), _sum1);
                _sum2 = _mm_add_epi32(_mm_madd_epi16(_val, _w2), _sum2);
                _sum3 = _mm_add_epi32(_mm_madd_epi16(_val, _w3), _sum3);
#endif
#endif

                tmpptr += 8;
                kptr0 += 32;
            }

#if __AVX2__
            __m128i _sum0 = _mm256_extracti128_si256(_sum0_1, 0);
            __m128i _sum1 = _mm256_extracti128_si256(_sum0_1, 1);
            __m128i _sum2 = _mm256_extracti128_si256(_sum2_3, 0);
            __m128i _sum3 = _mm256_extracti128_si256(_sum2_3, 1);
#endif

            // transpose 4x4
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum0, _sum1);
                _tmp1 = _mm_unpacklo_epi32(_sum2, _sum3);
                _tmp2 = _mm_unpackhi_epi32(_sum0, _sum1);
                _tmp3 = _mm_unpackhi_epi32(_sum2, _sum3);
                _sum0 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum1 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum2 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum3 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum0 = _mm_add_epi32(_sum0, _sum1);
            _sum2 = _mm_add_epi32(_sum2, _sum3);

            _sum0 = _mm_add_epi32(_sum0, _sum2);

            _mm_storeu_si128((__m128i*)outptr0, _sum0);
            outptr0 += 4;
        }
    }
}